

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

uint64_t helper_xgetbv_x86_64(CPUX86State *env,uint32_t ecx)

{
  uint64_t uVar1;
  uintptr_t unaff_retaddr;
  
  if ((*(byte *)((long)env->cr + 0x22) & 4) == 0) {
    raise_exception_ra_x86_64(env,6,unaff_retaddr);
  }
  if (ecx == 1) {
    if ((env->features[0x13] & 4) == 0) goto LAB_0050ac38;
    uVar1 = ((ulong)-(*(byte *)((long)&env->hflags + 3) >> 2 & 1) | 0xfffffffffffffff7) & env->xcr0;
  }
  else {
    if (ecx != 0) {
LAB_0050ac38:
      raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
    }
    uVar1 = env->xcr0;
  }
  return uVar1;
}

Assistant:

uint64_t helper_xgetbv(CPUX86State *env, uint32_t ecx)
{
    /* The OS must have enabled XSAVE.  */
    if (!(env->cr[4] & CR4_OSXSAVE_MASK)) {
        raise_exception_ra(env, EXCP06_ILLOP, GETPC());
    }

    switch (ecx) {
    case 0:
        return env->xcr0;
    case 1:
        if (env->features[FEAT_XSAVE] & CPUID_XSAVE_XGETBV1) {
            return env->xcr0 & get_xinuse(env);
        }
        break;
    }
    raise_exception_ra(env, EXCP0D_GPF, GETPC());
}